

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine_test.cpp
# Opt level: O0

void __thiscall
Engine_testConstructNoHandler_Test::Engine_testConstructNoHandler_Test
          (Engine_testConstructNoHandler_Test *this)

{
  undefined8 *in_RDI;
  Test *unaff_retaddr;
  
  testing::Test::Test(unaff_retaddr);
  *in_RDI = &PTR__Engine_testConstructNoHandler_Test_00276ee8;
  return;
}

Assistant:

TEST(Engine, testConstructNoHandler) {
    Engine e("foo");
    ASSERT_EQ("foo", e.prefix);
    ASSERT_EQ(0, e.GetHandlers().size());
    Engine e1(std::string("bar"));
    ASSERT_EQ("bar", e1.prefix);
    ASSERT_EQ(0, e1.GetHandlers().size());
}